

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMisc.c
# Opt level: O3

char ** Extra_Permutations(int n)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  char **pRes;
  char cVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  uint uVar23;
  uint uVar24;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  undefined1 auVar25 [16];
  undefined1 auVar30 [16];
  uint uVar31;
  uint uVar33;
  uint uVar34;
  undefined1 auVar32 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  uint uVar37;
  uint uVar39;
  undefined1 auVar38 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  int iVar44;
  undefined1 auVar43 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  int iVar66;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  int iVar67;
  int iVar71;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 in_XMM15 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  char Array [50];
  char local_68 [64];
  undefined1 local_28 [16];
  
  if (n < 1) {
    iVar15 = 1;
    pRes = (char **)Extra_ArrayAlloc(1,n,1);
  }
  else {
    uVar9 = n - 1;
    auVar25 = _DAT_009cc170;
    iVar15 = 4;
    uVar24 = 1;
    uVar37 = 1;
    uVar28 = 1;
    uVar39 = 1;
    do {
      uVar29 = uVar39;
      uVar27 = uVar28;
      uVar26 = uVar37;
      uVar23 = uVar24;
      uVar24 = auVar25._0_4_ * uVar23;
      uVar28 = (uint)((auVar25._8_8_ & 0xffffffff) * (ulong)uVar27);
      iVar10 = auVar25._4_4_;
      iVar14 = auVar25._12_4_;
      auVar45._4_4_ = iVar10;
      auVar45._0_4_ = iVar10;
      auVar45._8_4_ = iVar14;
      auVar45._12_4_ = iVar14;
      uVar37 = iVar10 * uVar26;
      uVar39 = (uint)((auVar45._8_8_ & 0xffffffff) * (ulong)uVar29);
      auVar42._0_4_ = auVar25._0_4_ + 4;
      auVar42._4_4_ = iVar10 + 4;
      auVar42._8_4_ = auVar25._8_4_ + 4;
      auVar42._12_4_ = iVar14 + 4;
      iVar10 = iVar15 + -4;
      iVar14 = iVar15 + (n + 3U & 0xfffffffc);
      auVar25 = auVar42;
      iVar15 = iVar10;
    } while (iVar14 != 8);
    uVar11 = -iVar10;
    uVar31 = -(uint)((int)(uVar9 ^ 0x80000000) < (int)(uVar11 ^ 0x80000000));
    uVar33 = -(uint)((int)(uVar9 ^ 0x80000000) < (int)((uVar11 | 1) ^ 0x80000000));
    uVar34 = -(uint)((int)(uVar9 ^ 0x80000000) < (int)((uVar11 | 2) ^ 0x80000000));
    uVar9 = -(uint)((int)(uVar9 ^ 0x80000000) < (int)((uVar11 | 3) ^ 0x80000000));
    iVar15 = (~uVar34 & uVar28 | uVar27 & uVar34) * (~uVar31 & uVar24 | uVar23 & uVar31) *
             (~uVar33 & uVar37 | uVar26 & uVar33) * (~uVar9 & uVar39 | uVar29 & uVar9);
    pRes = (char **)Extra_ArrayAlloc(iVar15,n,1);
    lVar12 = (ulong)(uint)n - 1;
    local_28._8_4_ = (int)lVar12;
    local_28._0_8_ = lVar12;
    local_28._12_4_ = (int)((ulong)lVar12 >> 0x20);
    uVar13 = 0;
    auVar25 = _DAT_009b63a0;
    auVar30 = _DAT_009b63b0;
    auVar32 = _DAT_009b63c0;
    auVar35 = _DAT_009b63d0;
    auVar36 = _DAT_009b63e0;
    auVar38 = _DAT_009b63f0;
    auVar40 = _DAT_0093e4e0;
    auVar41 = _DAT_0093d210;
    do {
      auVar42 = local_28 ^ _DAT_0093d220;
      auVar45 = auVar41 ^ _DAT_0093d220;
      iVar10 = auVar42._0_4_;
      iVar67 = -(uint)(iVar10 < auVar45._0_4_);
      iVar14 = auVar42._4_4_;
      auVar46._4_4_ = -(uint)(iVar14 < auVar45._4_4_);
      iVar66 = auVar42._8_4_;
      iVar71 = -(uint)(iVar66 < auVar45._8_4_);
      iVar44 = auVar42._12_4_;
      auVar46._12_4_ = -(uint)(iVar44 < auVar45._12_4_);
      auVar58._4_4_ = iVar67;
      auVar58._0_4_ = iVar67;
      auVar58._8_4_ = iVar71;
      auVar58._12_4_ = iVar71;
      auVar72 = pshuflw(in_XMM15,auVar58,0xe8);
      auVar48._4_4_ = -(uint)(auVar45._4_4_ == iVar14);
      auVar48._12_4_ = -(uint)(auVar45._12_4_ == iVar44);
      auVar48._0_4_ = auVar48._4_4_;
      auVar48._8_4_ = auVar48._12_4_;
      auVar42 = pshuflw(_DAT_0093d220,auVar48,0xe8);
      auVar46._0_4_ = auVar46._4_4_;
      auVar46._8_4_ = auVar46._12_4_;
      auVar45 = pshuflw(auVar72,auVar46,0xe8);
      auVar73._8_4_ = 0xffffffff;
      auVar73._0_8_ = 0xffffffffffffffff;
      auVar73._12_4_ = 0xffffffff;
      auVar73 = (auVar45 | auVar42 & auVar72) ^ auVar73;
      auVar42 = packssdw(auVar73,auVar73);
      cVar8 = (char)uVar13;
      if ((auVar42 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        local_68[uVar13] = cVar8;
      }
      auVar46 = auVar48 & auVar58 | auVar46;
      auVar45 = packssdw(auVar46,auVar46);
      auVar72._8_4_ = 0xffffffff;
      auVar72._0_8_ = 0xffffffffffffffff;
      auVar72._12_4_ = 0xffffffff;
      auVar45 = packssdw(auVar45 ^ auVar72,auVar45 ^ auVar72);
      auVar45 = packsswb(auVar45,auVar45);
      if ((auVar45._0_4_ >> 8 & 1) != 0) {
        local_68[uVar13 + 1] = cVar8 + '\x01';
      }
      auVar45 = auVar40 ^ _DAT_0093d220;
      iVar67 = -(uint)(iVar10 < auVar45._0_4_);
      auVar68._4_4_ = -(uint)(iVar14 < auVar45._4_4_);
      iVar71 = -(uint)(iVar66 < auVar45._8_4_);
      auVar68._12_4_ = -(uint)(iVar44 < auVar45._12_4_);
      auVar47._4_4_ = iVar67;
      auVar47._0_4_ = iVar67;
      auVar47._8_4_ = iVar71;
      auVar47._12_4_ = iVar71;
      iVar67 = -(uint)(auVar45._4_4_ == iVar14);
      iVar71 = -(uint)(auVar45._12_4_ == iVar44);
      auVar59._4_4_ = iVar67;
      auVar59._0_4_ = iVar67;
      auVar59._8_4_ = iVar71;
      auVar59._12_4_ = iVar71;
      auVar68._0_4_ = auVar68._4_4_;
      auVar68._8_4_ = auVar68._12_4_;
      auVar45 = auVar59 & auVar47 | auVar68;
      auVar45 = packssdw(auVar45,auVar45);
      auVar1._8_4_ = 0xffffffff;
      auVar1._0_8_ = 0xffffffffffffffff;
      auVar1._12_4_ = 0xffffffff;
      auVar45 = packssdw(auVar45 ^ auVar1,auVar45 ^ auVar1);
      auVar45 = packsswb(auVar45,auVar45);
      if ((auVar45._0_4_ >> 0x10 & 1) != 0) {
        local_68[uVar13 + 2] = cVar8 + '\x02';
      }
      auVar45 = pshufhw(auVar45,auVar47,0x84);
      auVar48 = pshufhw(auVar47,auVar59,0x84);
      auVar73 = pshufhw(auVar45,auVar68,0x84);
      auVar16._8_4_ = 0xffffffff;
      auVar16._0_8_ = 0xffffffffffffffff;
      auVar16._12_4_ = 0xffffffff;
      auVar16 = (auVar73 | auVar48 & auVar45) ^ auVar16;
      auVar45 = packssdw(auVar16,auVar16);
      auVar45 = packsswb(auVar45,auVar45);
      if ((auVar45._0_4_ >> 0x18 & 1) != 0) {
        local_68[uVar13 + 3] = cVar8 + '\x03';
      }
      auVar45 = auVar38 ^ _DAT_0093d220;
      iVar67 = -(uint)(iVar10 < auVar45._0_4_);
      auVar50._4_4_ = -(uint)(iVar14 < auVar45._4_4_);
      iVar71 = -(uint)(iVar66 < auVar45._8_4_);
      auVar50._12_4_ = -(uint)(iVar44 < auVar45._12_4_);
      auVar60._4_4_ = iVar67;
      auVar60._0_4_ = iVar67;
      auVar60._8_4_ = iVar71;
      auVar60._12_4_ = iVar71;
      auVar73 = pshuflw(auVar42,auVar60,0xe8);
      auVar17._0_4_ = -(uint)(auVar45._0_4_ == iVar10);
      auVar17._4_4_ = -(uint)(auVar45._4_4_ == iVar14);
      auVar17._8_4_ = -(uint)(auVar45._8_4_ == iVar66);
      auVar17._12_4_ = -(uint)(auVar45._12_4_ == iVar44);
      auVar49._4_4_ = auVar17._4_4_;
      auVar49._0_4_ = auVar17._4_4_;
      auVar49._8_4_ = auVar17._12_4_;
      auVar49._12_4_ = auVar17._12_4_;
      auVar42 = pshuflw(auVar17,auVar49,0xe8);
      auVar50._0_4_ = auVar50._4_4_;
      auVar50._8_4_ = auVar50._12_4_;
      auVar45 = pshuflw(auVar73,auVar50,0xe8);
      auVar74._8_4_ = 0xffffffff;
      auVar74._0_8_ = 0xffffffffffffffff;
      auVar74._12_4_ = 0xffffffff;
      auVar74 = (auVar45 | auVar42 & auVar73) ^ auVar74;
      auVar42 = packssdw(auVar42 & auVar73,auVar74);
      auVar42 = packsswb(auVar42,auVar42);
      if ((auVar42 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        local_68[uVar13 + 4] = cVar8 + '\x04';
      }
      auVar50 = auVar49 & auVar60 | auVar50;
      auVar45 = packssdw(auVar50,auVar50);
      auVar2._8_4_ = 0xffffffff;
      auVar2._0_8_ = 0xffffffffffffffff;
      auVar2._12_4_ = 0xffffffff;
      auVar42 = packssdw(auVar42,auVar45 ^ auVar2);
      auVar42 = packsswb(auVar42,auVar42);
      if ((auVar42._4_2_ >> 8 & 1) != 0) {
        local_68[uVar13 + 5] = cVar8 + '\x05';
      }
      auVar42 = auVar36 ^ _DAT_0093d220;
      iVar67 = -(uint)(iVar10 < auVar42._0_4_);
      auVar69._4_4_ = -(uint)(iVar14 < auVar42._4_4_);
      iVar71 = -(uint)(iVar66 < auVar42._8_4_);
      auVar69._12_4_ = -(uint)(iVar44 < auVar42._12_4_);
      auVar51._4_4_ = iVar67;
      auVar51._0_4_ = iVar67;
      auVar51._8_4_ = iVar71;
      auVar51._12_4_ = iVar71;
      iVar67 = -(uint)(auVar42._4_4_ == iVar14);
      iVar71 = -(uint)(auVar42._12_4_ == iVar44);
      auVar61._4_4_ = iVar67;
      auVar61._0_4_ = iVar67;
      auVar61._8_4_ = iVar71;
      auVar61._12_4_ = iVar71;
      auVar69._0_4_ = auVar69._4_4_;
      auVar69._8_4_ = auVar69._12_4_;
      auVar42 = auVar61 & auVar51 | auVar69;
      auVar42 = packssdw(auVar42,auVar42);
      auVar3._8_4_ = 0xffffffff;
      auVar3._0_8_ = 0xffffffffffffffff;
      auVar3._12_4_ = 0xffffffff;
      auVar42 = packssdw(auVar42 ^ auVar3,auVar42 ^ auVar3);
      auVar42 = packsswb(auVar42,auVar42);
      if ((auVar42 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        local_68[uVar13 + 6] = cVar8 + '\x06';
      }
      auVar42 = pshufhw(auVar42,auVar51,0x84);
      auVar73 = pshufhw(auVar51,auVar61,0x84);
      auVar45 = pshufhw(auVar42,auVar69,0x84);
      auVar18._8_4_ = 0xffffffff;
      auVar18._0_8_ = 0xffffffffffffffff;
      auVar18._12_4_ = 0xffffffff;
      auVar18 = (auVar45 | auVar73 & auVar42) ^ auVar18;
      auVar42 = packssdw(auVar18,auVar18);
      auVar42 = packsswb(auVar42,auVar42);
      if ((auVar42._6_2_ >> 8 & 1) != 0) {
        local_68[uVar13 + 7] = cVar8 + '\a';
      }
      auVar42 = auVar35 ^ _DAT_0093d220;
      iVar67 = -(uint)(iVar10 < auVar42._0_4_);
      auVar53._4_4_ = -(uint)(iVar14 < auVar42._4_4_);
      iVar71 = -(uint)(iVar66 < auVar42._8_4_);
      auVar53._12_4_ = -(uint)(iVar44 < auVar42._12_4_);
      auVar62._4_4_ = iVar67;
      auVar62._0_4_ = iVar67;
      auVar62._8_4_ = iVar71;
      auVar62._12_4_ = iVar71;
      auVar45 = pshuflw(auVar74,auVar62,0xe8);
      auVar19._0_4_ = -(uint)(auVar42._0_4_ == iVar10);
      auVar19._4_4_ = -(uint)(auVar42._4_4_ == iVar14);
      auVar19._8_4_ = -(uint)(auVar42._8_4_ == iVar66);
      auVar19._12_4_ = -(uint)(auVar42._12_4_ == iVar44);
      auVar52._4_4_ = auVar19._4_4_;
      auVar52._0_4_ = auVar19._4_4_;
      auVar52._8_4_ = auVar19._12_4_;
      auVar52._12_4_ = auVar19._12_4_;
      auVar42 = pshuflw(auVar19,auVar52,0xe8);
      auVar53._0_4_ = auVar53._4_4_;
      auVar53._8_4_ = auVar53._12_4_;
      auVar73 = pshuflw(auVar45,auVar53,0xe8);
      auVar75._8_4_ = 0xffffffff;
      auVar75._0_8_ = 0xffffffffffffffff;
      auVar75._12_4_ = 0xffffffff;
      auVar75 = (auVar73 | auVar42 & auVar45) ^ auVar75;
      auVar73 = packssdw(auVar75,auVar75);
      auVar42 = packsswb(auVar42 & auVar45,auVar73);
      if ((auVar42 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        local_68[uVar13 + 8] = cVar8 + '\b';
      }
      auVar53 = auVar52 & auVar62 | auVar53;
      auVar45 = packssdw(auVar53,auVar53);
      auVar4._8_4_ = 0xffffffff;
      auVar4._0_8_ = 0xffffffffffffffff;
      auVar4._12_4_ = 0xffffffff;
      auVar45 = packssdw(auVar45 ^ auVar4,auVar45 ^ auVar4);
      auVar42 = packsswb(auVar42,auVar45);
      if ((auVar42._8_2_ >> 8 & 1) != 0) {
        local_68[uVar13 + 9] = cVar8 + '\t';
      }
      auVar42 = auVar32 ^ _DAT_0093d220;
      iVar67 = -(uint)(iVar10 < auVar42._0_4_);
      auVar70._4_4_ = -(uint)(iVar14 < auVar42._4_4_);
      iVar71 = -(uint)(iVar66 < auVar42._8_4_);
      auVar70._12_4_ = -(uint)(iVar44 < auVar42._12_4_);
      auVar54._4_4_ = iVar67;
      auVar54._0_4_ = iVar67;
      auVar54._8_4_ = iVar71;
      auVar54._12_4_ = iVar71;
      iVar67 = -(uint)(auVar42._4_4_ == iVar14);
      iVar71 = -(uint)(auVar42._12_4_ == iVar44);
      auVar63._4_4_ = iVar67;
      auVar63._0_4_ = iVar67;
      auVar63._8_4_ = iVar71;
      auVar63._12_4_ = iVar71;
      auVar70._0_4_ = auVar70._4_4_;
      auVar70._8_4_ = auVar70._12_4_;
      auVar42 = auVar63 & auVar54 | auVar70;
      auVar42 = packssdw(auVar42,auVar42);
      auVar5._8_4_ = 0xffffffff;
      auVar5._0_8_ = 0xffffffffffffffff;
      auVar5._12_4_ = 0xffffffff;
      auVar42 = packssdw(auVar42 ^ auVar5,auVar42 ^ auVar5);
      auVar42 = packsswb(auVar42,auVar42);
      if ((auVar42 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        local_68[uVar13 + 10] = cVar8 + '\n';
      }
      auVar42 = pshufhw(auVar42,auVar54,0x84);
      auVar48 = pshufhw(auVar54,auVar63,0x84);
      auVar45 = pshufhw(auVar42,auVar70,0x84);
      auVar20._8_4_ = 0xffffffff;
      auVar20._0_8_ = 0xffffffffffffffff;
      auVar20._12_4_ = 0xffffffff;
      auVar20 = (auVar45 | auVar48 & auVar42) ^ auVar20;
      auVar42 = packssdw(auVar20,auVar20);
      auVar42 = packsswb(auVar42,auVar42);
      if ((auVar42._10_2_ >> 8 & 1) != 0) {
        local_68[uVar13 + 0xb] = cVar8 + '\v';
      }
      auVar42 = auVar30 ^ _DAT_0093d220;
      iVar67 = -(uint)(iVar10 < auVar42._0_4_);
      auVar56._4_4_ = -(uint)(iVar14 < auVar42._4_4_);
      iVar71 = -(uint)(iVar66 < auVar42._8_4_);
      auVar56._12_4_ = -(uint)(iVar44 < auVar42._12_4_);
      auVar64._4_4_ = iVar67;
      auVar64._0_4_ = iVar67;
      auVar64._8_4_ = iVar71;
      auVar64._12_4_ = iVar71;
      auVar45 = pshuflw(auVar73,auVar64,0xe8);
      auVar21._0_4_ = -(uint)(auVar42._0_4_ == iVar10);
      auVar21._4_4_ = -(uint)(auVar42._4_4_ == iVar14);
      auVar21._8_4_ = -(uint)(auVar42._8_4_ == iVar66);
      auVar21._12_4_ = -(uint)(auVar42._12_4_ == iVar44);
      auVar55._4_4_ = auVar21._4_4_;
      auVar55._0_4_ = auVar21._4_4_;
      auVar55._8_4_ = auVar21._12_4_;
      auVar55._12_4_ = auVar21._12_4_;
      auVar42 = pshuflw(auVar21,auVar55,0xe8);
      auVar56._0_4_ = auVar56._4_4_;
      auVar56._8_4_ = auVar56._12_4_;
      auVar73 = pshuflw(auVar45,auVar56,0xe8);
      in_XMM15._8_4_ = 0xffffffff;
      in_XMM15._0_8_ = 0xffffffffffffffff;
      in_XMM15._12_4_ = 0xffffffff;
      in_XMM15 = (auVar73 | auVar42 & auVar45) ^ in_XMM15;
      auVar42 = packssdw(auVar42 & auVar45,in_XMM15);
      auVar42 = packsswb(auVar42,auVar42);
      if ((auVar42 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        local_68[uVar13 + 0xc] = cVar8 + '\f';
      }
      auVar56 = auVar55 & auVar64 | auVar56;
      auVar45 = packssdw(auVar56,auVar56);
      auVar6._8_4_ = 0xffffffff;
      auVar6._0_8_ = 0xffffffffffffffff;
      auVar6._12_4_ = 0xffffffff;
      auVar42 = packssdw(auVar42,auVar45 ^ auVar6);
      auVar42 = packsswb(auVar42,auVar42);
      if ((auVar42._12_2_ >> 8 & 1) != 0) {
        local_68[uVar13 + 0xd] = cVar8 + '\r';
      }
      auVar42 = auVar25 ^ _DAT_0093d220;
      iVar10 = -(uint)(iVar10 < auVar42._0_4_);
      auVar65._4_4_ = -(uint)(iVar14 < auVar42._4_4_);
      iVar66 = -(uint)(iVar66 < auVar42._8_4_);
      auVar65._12_4_ = -(uint)(iVar44 < auVar42._12_4_);
      auVar57._4_4_ = iVar10;
      auVar57._0_4_ = iVar10;
      auVar57._8_4_ = iVar66;
      auVar57._12_4_ = iVar66;
      iVar10 = -(uint)(auVar42._4_4_ == iVar14);
      iVar14 = -(uint)(auVar42._12_4_ == iVar44);
      auVar43._4_4_ = iVar10;
      auVar43._0_4_ = iVar10;
      auVar43._8_4_ = iVar14;
      auVar43._12_4_ = iVar14;
      auVar65._0_4_ = auVar65._4_4_;
      auVar65._8_4_ = auVar65._12_4_;
      auVar42 = auVar43 & auVar57 | auVar65;
      auVar42 = packssdw(auVar42,auVar42);
      auVar7._8_4_ = 0xffffffff;
      auVar7._0_8_ = 0xffffffffffffffff;
      auVar7._12_4_ = 0xffffffff;
      auVar42 = packssdw(auVar42 ^ auVar7,auVar42 ^ auVar7);
      auVar42 = packsswb(auVar42,auVar42);
      if ((auVar42 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        local_68[uVar13 + 0xe] = cVar8 + '\x0e';
      }
      auVar42 = pshufhw(auVar42,auVar57,0x84);
      auVar73 = pshufhw(auVar43,auVar43,0x84);
      auVar45 = pshufhw(auVar42,auVar65,0x84);
      auVar22._8_4_ = 0xffffffff;
      auVar22._0_8_ = 0xffffffffffffffff;
      auVar22._12_4_ = 0xffffffff;
      auVar22 = (auVar45 | auVar73 & auVar42) ^ auVar22;
      auVar42 = packssdw(auVar22,auVar22);
      auVar42 = packsswb(auVar42,auVar42);
      if ((auVar42._14_2_ >> 8 & 1) != 0) {
        local_68[uVar13 + 0xf] = cVar8 + '\x0f';
      }
      uVar13 = uVar13 + 0x10;
      lVar12 = auVar41._8_8_;
      auVar41._0_8_ = auVar41._0_8_ + 0x10;
      auVar41._8_8_ = lVar12 + 0x10;
      lVar12 = auVar40._8_8_;
      auVar40._0_8_ = auVar40._0_8_ + 0x10;
      auVar40._8_8_ = lVar12 + 0x10;
      lVar12 = auVar38._8_8_;
      auVar38._0_8_ = auVar38._0_8_ + 0x10;
      auVar38._8_8_ = lVar12 + 0x10;
      lVar12 = auVar36._8_8_;
      auVar36._0_8_ = auVar36._0_8_ + 0x10;
      auVar36._8_8_ = lVar12 + 0x10;
      lVar12 = auVar35._8_8_;
      auVar35._0_8_ = auVar35._0_8_ + 0x10;
      auVar35._8_8_ = lVar12 + 0x10;
      lVar12 = auVar32._8_8_;
      auVar32._0_8_ = auVar32._0_8_ + 0x10;
      auVar32._8_8_ = lVar12 + 0x10;
      lVar12 = auVar30._8_8_;
      auVar30._0_8_ = auVar30._0_8_ + 0x10;
      auVar30._8_8_ = lVar12 + 0x10;
      lVar12 = auVar25._8_8_;
      auVar25._0_8_ = auVar25._0_8_ + 0x10;
      auVar25._8_8_ = lVar12 + 0x10;
    } while ((n + 0xfU & 0xfffffff0) != uVar13);
  }
  Extra_Permutations_rec(pRes,iVar15,n,local_68);
  return pRes;
}

Assistant:

char ** Extra_Permutations( int n )
{
    char Array[50];
    char ** pRes;
    int nFact, i;
    // allocate memory
    nFact = Extra_Factorial( n );
    pRes  = (char **)Extra_ArrayAlloc( nFact, n, sizeof(char) );
    // fill in the permutations
    for ( i = 0; i < n; i++ )
        Array[i] = i;
    Extra_Permutations_rec( pRes, nFact, n, Array );
    // print the permutations
/*
    {
    int i, k;
    for ( i = 0; i < nFact; i++ )
    {
        printf( "{" );
        for ( k = 0; k < n; k++ )
            printf( " %d", pRes[i][k] );
        printf( " }\n" );
    }
    }
*/
    return pRes;
}